

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::makewt(int nw,int *ip,double *w)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 *in_RDX;
  int *in_RSI;
  int in_EDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double wk3i;
  double wk3r;
  double wk1i;
  double wk1r;
  double wn4r;
  double delta;
  int nw1;
  int nw0;
  int nwh;
  int j;
  int local_24;
  int local_20;
  int local_1c;
  
  *in_RSI = in_EDI;
  in_RSI[1] = 1;
  if (2 < in_EDI) {
    local_20 = in_EDI >> 1;
    dVar5 = atan(1.0);
    dVar5 = dVar5 / (double)local_20;
    dVar6 = cos(dVar5 * (double)local_20);
    *in_RDX = 0x3ff0000000000000;
    in_RDX[1] = dVar6;
    if (local_20 == 4) {
      dVar7 = cos(dVar5 * 2.0);
      in_RDX[2] = dVar7;
      dVar5 = sin(dVar5 * 2.0);
      in_RDX[3] = dVar5;
    }
    else if (4 < local_20) {
      makeipt(in_EDI,in_RSI);
      dVar7 = cos(dVar5 * 2.0);
      in_RDX[2] = 0.5 / dVar7;
      dVar7 = cos(dVar5 * 6.0);
      in_RDX[3] = 0.5 / dVar7;
      for (local_1c = 4; local_1c < local_20; local_1c = local_1c + 4) {
        dVar7 = cos(dVar5 * (double)local_1c);
        in_RDX[local_1c] = dVar7;
        dVar7 = sin(dVar5 * (double)local_1c);
        in_RDX[local_1c + 1] = dVar7;
        dVar7 = cos(dVar5 * 3.0 * (double)local_1c);
        in_RDX[local_1c + 2] = dVar7;
        dVar7 = sin(dVar5 * 3.0 * (double)local_1c);
        in_RDX[local_1c + 3] = -dVar7;
      }
    }
    local_24 = 0;
    iVar4 = local_24;
    while (local_24 = iVar4, 2 < local_20) {
      iVar4 = local_24 + local_20;
      local_20 = local_20 >> 1;
      in_RDX[iVar4] = 0x3ff0000000000000;
      in_RDX[iVar4 + 1] = dVar6;
      if (local_20 == 4) {
        uVar1 = in_RDX[local_24 + 5];
        in_RDX[iVar4 + 2] = in_RDX[local_24 + 4];
        in_RDX[iVar4 + 3] = uVar1;
      }
      else if (4 < local_20) {
        dVar5 = (double)in_RDX[local_24 + 6];
        in_RDX[iVar4 + 2] = 0.5 / (double)in_RDX[local_24 + 4];
        in_RDX[iVar4 + 3] = 0.5 / dVar5;
        for (local_1c = 4; local_1c < local_20; local_1c = local_1c + 4) {
          uVar1 = in_RDX[local_24 + local_1c * 2 + 1];
          uVar2 = in_RDX[local_24 + local_1c * 2 + 2];
          uVar3 = in_RDX[local_24 + local_1c * 2 + 3];
          in_RDX[iVar4 + local_1c] = in_RDX[local_24 + local_1c * 2];
          in_RDX[iVar4 + local_1c + 1] = uVar1;
          in_RDX[iVar4 + local_1c + 2] = uVar2;
          in_RDX[iVar4 + local_1c + 3] = uVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void makewt(int nw, int *ip, double *w) {
#if 0
  void makeipt(int nw, int *ip);
#endif
  int j, nwh, nw0, nw1;
  double delta, wn4r, wk1r, wk1i, wk3r, wk3i;

  ip[0] = nw;
  ip[1] = 1;
  if (nw > 2) {
    nwh = nw >> 1;
    delta = atan(1.0) / nwh;
    wn4r = cos(delta * nwh);
    w[0] = 1;
    w[1] = wn4r;
    if (nwh == 4) {
      w[2] = cos(delta * 2);
      w[3] = sin(delta * 2);
    } else if (nwh > 4) {
      makeipt(nw, ip);
      w[2] = 0.5 / cos(delta * 2);
      w[3] = 0.5 / cos(delta * 6);
      for (j = 4; j < nwh; j += 4) {
        w[j] = cos(delta * j);
        w[j + 1] = sin(delta * j);
        w[j + 2] = cos(3 * delta * j);
        w[j + 3] = -sin(3 * delta * j);
      }
    }
    nw0 = 0;
    while (nwh > 2) {
      nw1 = nw0 + nwh;
      nwh >>= 1;
      w[nw1] = 1;
      w[nw1 + 1] = wn4r;
      if (nwh == 4) {
        wk1r = w[nw0 + 4];
        wk1i = w[nw0 + 5];
        w[nw1 + 2] = wk1r;
        w[nw1 + 3] = wk1i;
      } else if (nwh > 4) {
        wk1r = w[nw0 + 4];
        wk3r = w[nw0 + 6];
        w[nw1 + 2] = 0.5 / wk1r;
        w[nw1 + 3] = 0.5 / wk3r;
        for (j = 4; j < nwh; j += 4) {
          wk1r = w[nw0 + 2 * j];
          wk1i = w[nw0 + 2 * j + 1];
          wk3r = w[nw0 + 2 * j + 2];
          wk3i = w[nw0 + 2 * j + 3];
          w[nw1 + j] = wk1r;
          w[nw1 + j + 1] = wk1i;
          w[nw1 + j + 2] = wk3r;
          w[nw1 + j + 3] = wk3i;
        }
      }
      nw0 = nw1;
    }
  }
}